

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RenderDeviceBase.hpp
# Opt level: O0

void __thiscall
Diligent::RenderDeviceBase<Diligent::EngineVkImplTraits>::RecycleDynamicBufferId
          (RenderDeviceBase<Diligent::EngineVkImplTraits> *this,Uint32 Id)

{
  Char *Message;
  byte extraout_DL;
  uint *__args;
  char (*in_R8) [54];
  undefined1 local_70 [8];
  string msg;
  lock_guard<Threading::SpinLock> local_20;
  SpinLockGuard Guard;
  Uint32 Id_local;
  RenderDeviceBase<Diligent::EngineVkImplTraits> *this_local;
  
  Guard._M_device._4_4_ = Id;
  std::lock_guard<Threading::SpinLock>::lock_guard(&local_20,&this->m_RecycledDynamicBufferIdsLock);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
            (&this->m_RecycledDynamicBufferIds,(value_type_conflict *)((long)&Guard._M_device + 4));
  msg.field_2._8_8_ =
       std::
       unordered_set<unsigned_int,std::hash<unsigned_int>,std::equal_to<unsigned_int>,std::allocator<unsigned_int>>
       ::emplace<unsigned_int&>
                 ((pair<std::__detail::_Node_iterator<unsigned_int,_true,_false>,_bool> *)
                  &this->m_DbgRecycledDynamicBufferIds,
                  (unordered_set<unsigned_int,std::hash<unsigned_int>,std::equal_to<unsigned_int>,std::allocator<unsigned_int>>
                   *)((long)&Guard._M_device + 4),__args);
  if (((extraout_DL ^ 0xff) & 1) != 0) {
    FormatString<char[19],unsigned_int,char[54]>
              ((string *)local_70,(Diligent *)"Dynamic buffer ID ",
               (char (*) [19])((long)&Guard._M_device + 4),
               (uint *)" has already been recycled. This appears to be a bug.",in_R8);
    Message = (Char *)std::__cxx11::string::c_str();
    DebugAssertionFailed
              (Message,"RecycleDynamicBufferId",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/RenderDeviceBase.hpp"
               ,0x180);
    std::__cxx11::string::~string((string *)local_70);
  }
  std::lock_guard<Threading::SpinLock>::~lock_guard(&local_20);
  return;
}

Assistant:

void RecycleDynamicBufferId(Uint32 Id)
    {
        Threading::SpinLockGuard Guard{m_RecycledDynamicBufferIdsLock};
        m_RecycledDynamicBufferIds.push_back(Id);
#ifdef DILIGENT_DEBUG
        VERIFY(m_DbgRecycledDynamicBufferIds.emplace(Id).second, "Dynamic buffer ID ", Id, " has already been recycled. This appears to be a bug.");
#endif
    }